

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  cpp *this_00;
  string *value4;
  FieldDescriptor *pFVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  FieldGenerator *pFVar6;
  Descriptor *pDVar7;
  Options *in_RCX;
  Descriptor *in_RDX;
  FieldDescriptor *field;
  int j;
  undefined4 uVar8;
  long lVar9;
  char *text;
  string *psVar10;
  ulong uVar11;
  long lVar12;
  int i;
  reference rVar13;
  allocator local_152;
  allocator local_151;
  string local_150;
  string *local_130;
  long local_128;
  vector<bool,_std::allocator<bool>_> processed;
  string initializer_null;
  string cached_size_decl;
  string initializer_with_arena;
  string superclass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  superclass._M_dataplus._M_p = (pointer)&superclass.field_2;
  superclass._M_string_length = 0;
  superclass.field_2._M_local_buf[0] = '\0';
  if (this->use_dependent_base_ == true) {
    DependentBaseClassTemplateName_abi_cxx11_(&cached_size_decl,(cpp *)this->descriptor_,in_RDX);
    std::operator+(&initializer_null,&cached_size_decl,"<");
    std::operator+(&initializer_with_arena,&initializer_null,&this->classname_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&processed,
                   &initializer_with_arena,">");
    std::__cxx11::string::operator=((string *)&superclass,(string *)&processed);
    std::__cxx11::string::~string((string *)&processed);
    std::__cxx11::string::~string((string *)&initializer_with_arena);
    std::__cxx11::string::~string((string *)&initializer_null);
    psVar10 = &cached_size_decl;
  }
  else {
    SuperClassName_abi_cxx11_
              ((string *)&processed,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
    psVar10 = (string *)&processed;
    std::__cxx11::string::operator=((string *)&superclass,(string *)psVar10);
  }
  std::__cxx11::string::~string((string *)psVar10);
  std::operator+(&initializer_with_arena,&superclass,"()");
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  std::__cxx11::string::append((char *)&initializer_with_arena);
  uVar11 = 0;
  while( true ) {
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar11)
    break;
    this_00 = (cpp *)ppFVar1[uVar11];
    if (*(int *)(this_00 + 0x4c) == 3) {
      std::__cxx11::string::string((string *)&cached_size_decl,",\n  ",&local_151);
      FieldName_abi_cxx11_(&local_150,this_00,field);
      std::operator+(&initializer_null,&cached_size_decl,&local_150);
      std::__cxx11::string::string((string *)&local_78,"_(arena)",&local_152);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&processed
                     ,&initializer_null,&local_78);
      std::__cxx11::string::append((string *)&initializer_with_arena);
      std::__cxx11::string::~string((string *)&processed);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&initializer_null);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&cached_size_decl);
    }
    uVar11 = uVar11 + 1;
  }
  bVar3 = IsAnyMessage(this->descriptor_);
  if (bVar3) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  initializer_null._M_dataplus._M_p = (pointer)&initializer_null.field_2;
  initializer_null._M_string_length = 0;
  initializer_null.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&initializer_null);
  bVar3 = IsAnyMessage(this->descriptor_);
  if (bVar3) {
    std::__cxx11::string::append((char *)&initializer_null);
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::append((char *)&initializer_null);
  }
  psVar10 = *(string **)(this->descriptor_ + 8);
  FileLevelNamespace((string *)&processed,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  local_130 = &this->classname_;
  io::Printer::Print(printer,
                     "$classname$::$classname$()\n  : $superclass$()$initializer$ {\n  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {\n    $file_namespace$::InitDefaults();\n  }\n  SharedCtor();\n  // @@protoc_insertion_point(constructor:$full_name$)\n}\n"
                     ,"classname",local_130,"superclass",&superclass,"full_name",psVar10,
                     "initializer",&initializer_null,"file_namespace",(string *)&processed);
  std::__cxx11::string::~string((string *)&processed);
  pDVar7 = this->descriptor_;
  psVar10 = local_130;
  if (*(char *)((*(undefined8 **)(pDVar7 + 0x10))[0x14] + 0xa7) == '\x01') {
    value4 = *(string **)(pDVar7 + 8);
    FileLevelNamespace((string *)&processed,(string *)**(undefined8 **)(pDVar7 + 0x10));
    psVar10 = local_130;
    io::Printer::Print(printer,
                       "$classname$::$classname$(::google::protobuf::Arena* arena)\n  : $initializer$ {\n#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n  $file_namespace$::InitDefaults();\n#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n  SharedCtor();\n  RegisterArenaDtor(arena);\n  // @@protoc_insertion_point(arena_constructor:$full_name$)\n}\n"
                       ,"initializer",&initializer_with_arena,"classname",local_130,"superclass",
                       &superclass,"full_name",value4,"file_namespace",(string *)&processed);
    std::__cxx11::string::~string((string *)&processed);
    pDVar7 = this->descriptor_;
  }
  io::Printer::Print(printer,"$classname$::$classname$(const $classname$& from)\n  : $superclass$()"
                     ,"classname",psVar10,"superclass",&superclass,"full_name",
                     *(string **)(pDVar7 + 8));
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,",\n_internal_metadata_(NULL)");
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,",\n_has_bits_(from._has_bits_)");
  }
  std::__cxx11::string::string
            ((string *)&cached_size_decl,",\n_cached_size_(0)",(allocator *)&processed);
  uVar8 = (undefined4)CONCAT71((int7)((ulong)&superclass >> 8),1);
  if ((*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) &&
     (sVar4 = HasBitsSize(this), (sVar4 & 7) != 0)) {
    io::Printer::Print(printer,cached_size_decl._M_dataplus._M_p);
    uVar8 = 0;
  }
  local_128 = CONCAT44(local_128._4_4_,uVar8);
  local_150._M_dataplus._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&processed,
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_150,
             (allocator_type *)&local_78);
  for (uVar11 = 0;
      ppFVar1 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->optimized_order_).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar11 = uVar11 + 1) {
    pFVar2 = ppFVar1[uVar11];
    if ((*(int *)(pFVar2 + 0x4c) == 3) && (bVar3 = FieldDescriptor::is_map(pFVar2), !bVar3)) {
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&processed,uVar11);
      *rVar13._M_p = *rVar13._M_p | (ulong)rVar13._M_mask;
      FieldName_abi_cxx11_(&local_150,(cpp *)pFVar2,(FieldDescriptor *)rVar13._M_mask);
      io::Printer::Print(printer,",\n$name$_(from.$name$_)","name",&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  if ((char)local_128 != '\0') {
    io::Printer::Print(printer,cached_size_decl._M_dataplus._M_p);
  }
  bVar3 = IsAnyMessage(this->descriptor_);
  if (bVar3) {
    io::Printer::Print(printer,",\n_any_metadata_(&type_url_, &value_)");
  }
  if (0 < this->num_weak_fields_) {
    io::Printer::Print(printer,",\n_weak_field_map_(from._weak_field_map_)");
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," {\n");
  io::Printer::Print(printer,"_internal_metadata_.MergeFrom(from._internal_metadata_);\n");
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,&processed);
  GenerateConstructorBody(this,printer,(vector<bool,_std::allocator<bool>_> *)&local_58,true);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  lVar9 = 0;
  while (lVar9 < *(int *)(this->descriptor_ + 0x38)) {
    lVar12 = lVar9 * 0x30;
    local_128 = lVar9;
    io::Printer::Print(printer,"clear_has_$oneofname$();\nswitch (from.$oneofname$_case()) {\n",
                       "oneofname",*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar12));
    io::Printer::Indent(printer);
    for (lVar9 = 0; lVar5 = *(long *)(this->descriptor_ + 0x40) + lVar12,
        lVar9 < *(int *)(*(long *)(this->descriptor_ + 0x40) + 0x1c + lVar12); lVar9 = lVar9 + 1) {
      pFVar2 = *(FieldDescriptor **)(*(long *)(lVar5 + 0x20) + lVar9 * 8);
      UnderscoresToCamelCase(&local_150,*(string **)pFVar2,true);
      io::Printer::Print(printer,"case k$field_name$: {\n","field_name",&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      io::Printer::Indent(printer);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar2);
      (*pFVar6->_vptr_FieldGenerator[0xb])(pFVar6,printer);
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    lVar5 = lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x40);
    SimpleItoa_abi_cxx11_(&local_150,(protobuf *)(lVar5 / 0x30 & 0xffffffff),(int)(lVar5 % 0x30));
    ToUpper(&local_78,*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar12));
    io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","oneof_index",
                       &local_150,"cap_oneof_name",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_150);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    lVar9 = local_128 + 1;
  }
  io::Printer::Outdent(printer);
  psVar10 = local_130;
  io::Printer::Print(printer,"  // @@protoc_insertion_point(copy_constructor:$full_name$)\n}\n\n",
                     "full_name",*(string **)(this->descriptor_ + 8));
  GenerateSharedConstructorCode(this,printer);
  io::Printer::Print(printer,
                     "$classname$::~$classname$() {\n  // @@protoc_insertion_point(destructor:$full_name$)\n  SharedDtor();\n}\n\n"
                     ,"classname",psVar10,"full_name",*(string **)(this->descriptor_ + 8));
  GenerateSharedDestructorCode(this,printer);
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) == '\x01') {
    GenerateArenaDestructorCode(this,printer);
  }
  io::Printer::Print(printer,
                     "void $classname$::SetCachedSize(int size) const {\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n}\n"
                     ,"classname",psVar10);
  pDVar7 = this->descriptor_;
  if ((((this->options_).enforce_lite == false) &&
      (*(int *)((*(undefined8 **)(pDVar7 + 0x10))[0x14] + 0xa8) != 3)) &&
     (*(char *)(*(long *)(pDVar7 + 0x20) + 0x69) == '\0')) {
    FileLevelNamespace(&local_150,(string *)**(undefined8 **)(pDVar7 + 0x10));
    io::Printer::Print(printer,
                       "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[kIndexInFileMessages].descriptor;\n}\n\n"
                       ,"classname",psVar10,"file_namespace",&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    pDVar7 = this->descriptor_;
  }
  FileLevelNamespace(&local_150,(string *)**(undefined8 **)(pDVar7 + 0x10));
  io::Printer::Print(printer,
                     "const $classname$& $classname$::default_instance() {\n  $file_namespace$::InitDefaults();\n  return *internal_default_instance();\n}\n\n"
                     ,"classname",psVar10,"file_namespace",&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  text = 
  "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n  $classname$* n = new $classname$;\n  if (arena != NULL) {\n    arena->Own(n);\n  }\n  return n;\n}\n"
  ;
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) != '\0') {
    text = 
    "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n  return ::google::protobuf::Arena::CreateMessage<$classname$>(arena);\n}\n"
    ;
  }
  io::Printer::Print(printer,text,"classname",psVar10);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&processed.super__Bvector_base<std::allocator<bool>_>);
  std::__cxx11::string::~string((string *)&cached_size_decl);
  std::__cxx11::string::~string((string *)&initializer_null);
  std::__cxx11::string::~string((string *)&initializer_with_arena);
  std::__cxx11::string::~string((string *)&superclass);
  return;
}

Assistant:

void MessageGenerator::
GenerateStructors(io::Printer* printer) {
  string superclass;
  if (use_dependent_base_) {
    superclass =
        DependentBaseClassTemplateName(descriptor_) + "<" + classname_ + ">";
  } else {
    superclass = SuperClassName(descriptor_, options_);
  }
  string initializer_with_arena = superclass + "()";

  if (descriptor_->extension_range_count() > 0) {
    initializer_with_arena += ",\n  _extensions_(arena)";
  }

  initializer_with_arena += ",\n  _internal_metadata_(arena)";

  // Initialize member variables with arena constructor.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];

    bool has_arena_constructor = field->is_repeated();
    if (has_arena_constructor) {
      initializer_with_arena += string(",\n  ") +
          FieldName(field) + string("_(arena)");
    }
  }

  if (IsAnyMessage(descriptor_)) {
    initializer_with_arena += ",\n  _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_with_arena += ", _weak_field_map_(arena)";
  }

  string initializer_null;
  initializer_null = ", _internal_metadata_(NULL)";
  if (IsAnyMessage(descriptor_)) {
    initializer_null += ", _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_null += ", _weak_field_map_(NULL)";
  }

  printer->Print(
      "$classname$::$classname$()\n"
      "  : $superclass$()$initializer$ {\n"
      "  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {\n"
      "    $file_namespace$::InitDefaults();\n"
      "  }\n"
      "  SharedCtor();\n"
      "  // @@protoc_insertion_point(constructor:$full_name$)\n"
      "}\n",
      "classname", classname_, "superclass", superclass, "full_name",
      descriptor_->full_name(), "initializer", initializer_null,
      "file_namespace", FileLevelNamespace(descriptor_->file()->name()));

  if (SupportsArenas(descriptor_)) {
    printer->Print(
        "$classname$::$classname$(::google::protobuf::Arena* arena)\n"
        "  : $initializer$ {\n"
        // When arenas are used it's safe to assume we have finished
        // static init time (protos with arenas are unsafe during static init)
        "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
        "  $file_namespace$::InitDefaults();\n"
        "#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
        "  SharedCtor();\n"
        "  RegisterArenaDtor(arena);\n"
        "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n"
        "}\n",
        "initializer", initializer_with_arena, "classname", classname_,
        "superclass", superclass, "full_name", descriptor_->full_name(),
        "file_namespace", FileLevelNamespace(descriptor_->file()->name()));
  }

  // Generate the copy constructor.
  printer->Print(
    "$classname$::$classname$(const $classname$& from)\n"
    "  : $superclass$()",
    "classname", classname_,
    "superclass", superclass,
    "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Indent();
  printer->Indent();

  printer->Print(
      ",\n_internal_metadata_(NULL)");

  if (HasFieldPresence(descriptor_->file())) {
      printer->Print(",\n_has_bits_(from._has_bits_)");
  }

  bool need_to_emit_cached_size = true;
  const string cached_size_decl = ",\n_cached_size_(0)";
  // We reproduce the logic used for laying out _cached_sized_ in the class
  // definition, as to initialize it in-order.
  if (HasFieldPresence(descriptor_->file()) &&
      (HasBitsSize() % 8) != 0) {
    printer->Print(cached_size_decl.c_str());
    need_to_emit_cached_size = false;
  }

  std::vector<bool> processed(optimized_order_.size(), false);
  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];

    if (!(field->is_repeated() && !(field->is_map()))
        ) {
      continue;
    }

    processed[i] = true;
    printer->Print(",\n$name$_(from.$name$_)",
                   "name", FieldName(field));
  }

  if (need_to_emit_cached_size) {
    printer->Print(cached_size_decl.c_str());
    need_to_emit_cached_size = false;
  }

  if (IsAnyMessage(descriptor_)) {
    printer->Print(",\n_any_metadata_(&type_url_, &value_)");
  }
  if (num_weak_fields_ > 0) {
    printer->Print(",\n_weak_field_map_(from._weak_field_map_)");
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(" {\n");

  printer->Print(
      "_internal_metadata_.MergeFrom(from._internal_metadata_);\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  GenerateConstructorBody(printer, processed, true);

  // Copy oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "clear_has_$oneofname$();\n"
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "oneof_index",
        SimpleItoa(descriptor_->oneof_decl(i)->index()),
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n"
    "}\n"
    "\n",
    "full_name", descriptor_->full_name());

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  printer->Print(
    "$classname$::~$classname$() {\n"
    "  // @@protoc_insertion_point(destructor:$full_name$)\n"
    "  SharedDtor();\n"
    "}\n"
    "\n",
    "classname", classname_,
    "full_name", descriptor_->full_name());

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate the arena-specific destructor code.
  if (SupportsArenas(descriptor_)) {
    GenerateArenaDestructorCode(printer);
  }

  // Generate SetCachedSize.
  printer->Print(
    "void $classname$::SetCachedSize(int size) const {\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "  _cached_size_ = size;\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "}\n",
    "classname", classname_);

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file(), options_) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_metadata[kIndexInFileMessages]."
        "descriptor;\n"
        "}\n"
        "\n",
        "classname", classname_, "file_namespace",
        FileLevelNamespace(descriptor_->file()->name()));
  }

  printer->Print(
      "const $classname$& $classname$::default_instance() {\n"
      "  $file_namespace$::InitDefaults();\n"
      "  return *internal_default_instance();\n"
      "}\n\n",
      "classname", classname_, "file_namespace",
      FileLevelNamespace(descriptor_->file()->name()));

  if (SupportsArenas(descriptor_)) {
    printer->Print(
      "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n"
      "  return ::google::protobuf::Arena::CreateMessage<$classname$>(arena);\n"
      "}\n",
      "classname", classname_);
  } else {
    printer->Print(
      "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n"
      "  $classname$* n = new $classname$;\n"
      "  if (arena != NULL) {\n"
      "    arena->Own(n);\n"
      "  }\n"
      "  return n;\n"
      "}\n",
      "classname", classname_);
  }

}